

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void AddInterfaceEntries(cmGeneratorTarget *thisTarget,string *config,string *prop,
                        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                        *entries)

{
  string *__return_storage_ptr__;
  bool bVar1;
  cmLinkImplementationLibraries *this;
  reference item;
  cmGlobalGenerator *this_00;
  pointer this_01;
  TargetPropertyEntryGenex *this_02;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_138;
  TargetPropertyEntryGenex *local_130;
  undefined1 local_128 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_110 [8];
  cmGeneratorExpression ge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string genex;
  string uniqueName;
  cmLinkImplItem *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range2;
  cmLinkImplementationLibraries *impl;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *entries_local;
  string *prop_local;
  string *config_local;
  cmGeneratorTarget *thisTarget_local;
  
  this = cmGeneratorTarget::GetLinkImplementationLibraries(thisTarget,config);
  if (this != (cmLinkImplementationLibraries *)0x0) {
    __end2 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(&this->Libraries);
    lib = (cmLinkImplItem *)
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this->Libraries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                       *)&lib), bVar1) {
      item = __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&__end2);
      if ((item->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) {
        this_00 = cmGeneratorTarget::GetGlobalGenerator(thisTarget);
        __return_storage_ptr__ = (string *)((long)&genex.field_2 + 8);
        cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                  (__return_storage_ptr__,this_00,(item->super_cmLinkItem).Target);
        std::operator+(&local_f0,"$<TARGET_PROPERTY:",__return_storage_ptr__);
        std::operator+(&local_d0,&local_f0,",");
        std::operator+(&local_b0,&local_d0,prop);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,&local_b0,">");
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        cmListFileBacktrace::cmListFileBacktrace
                  ((cmListFileBacktrace *)&cge,&(item->super_cmLinkItem).Backtrace);
        cmGeneratorExpression::cmGeneratorExpression
                  ((cmGeneratorExpression *)local_110,(cmListFileBacktrace *)&cge);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
        cmGeneratorExpression::Parse((cmGeneratorExpression *)local_128,(string *)local_110);
        this_01 = std::
                  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                  ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                *)local_128);
        cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_01,true);
        this_02 = (TargetPropertyEntryGenex *)operator_new(0x28);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::unique_ptr(&local_138,
                     (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      *)local_128);
        TargetPropertyEntryGenex::TargetPropertyEntryGenex(this_02,&local_138,item);
        local_130 = this_02;
        std::
        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
        ::push_back(entries,(value_type *)&local_130);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr(&local_138);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       *)local_128);
        cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_110);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)(genex.field_2._M_local_buf + 8));
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

static void AddInterfaceEntries(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& prop,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries)
{
  if (cmLinkImplementationLibraries const* impl =
        thisTarget->GetLinkImplementationLibraries(config)) {
    for (cmLinkImplItem const& lib : impl->Libraries) {
      if (lib.Target) {
        std::string uniqueName =
          thisTarget->GetGlobalGenerator()->IndexGeneratorTargetUniquely(
            lib.Target);
        std::string genex =
          "$<TARGET_PROPERTY:" + std::move(uniqueName) + "," + prop + ">";
        cmGeneratorExpression ge(lib.Backtrace);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(new TargetPropertyEntryGenex(std::move(cge), lib));
      }
    }
  }
}